

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_surrogate(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_GRID surrogate;
  REF_FACELIFT ref_facelift;
  
  uVar1 = ref_import_by_extension(&surrogate,ref_grid->mpi,filename);
  if (uVar1 == 0) {
    uVar1 = ref_geom_share_context(surrogate->geom,ref_grid->geom);
    if (uVar1 == 0) {
      if (surrogate->geom->model != (void *)0x0) {
        uVar1 = ref_egads_mark_jump_degen(surrogate);
        if (uVar1 != 0) {
          pcVar3 = "T and UV jumps; UV degen";
          uVar2 = 0x207;
          goto LAB_001a4fda;
        }
        uVar1 = ref_geom_verify_topo(surrogate);
        if (uVar1 != 0) {
          pcVar3 = "geom topo";
          uVar2 = 0x208;
          goto LAB_001a4fda;
        }
      }
      uVar1 = ref_facelift_create(&ref_facelift,surrogate,1);
      if (uVar1 == 0) {
        ref_grid->geom->ref_facelift = ref_facelift;
        return 0;
      }
      pcVar3 = "create";
      uVar2 = 0x20a;
    }
    else {
      pcVar3 = "share context";
      uVar2 = 0x205;
    }
  }
  else {
    pcVar3 = "import";
    uVar2 = 0x1f5;
  }
LAB_001a4fda:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar2,
         "ref_facelift_surrogate",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_surrogate(REF_GRID ref_grid,
                                          const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GLOB nnode = 0;
  REF_GRID surrogate;
  REF_FACELIFT ref_facelift;
  REF_BOOL all_read = REF_TRUE;
  if (all_read) {
    RSS(ref_import_by_extension(&surrogate, ref_mpi, filename), "import");
  } else {
    if (ref_mpi_once(ref_mpi)) {
      RSS(ref_import_by_extension(&surrogate, ref_mpi, filename), "import");
      nnode = ref_node_n_global(ref_grid_node(surrogate));
      RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_GLOB_TYPE), "bcast nnode");
    } else {
      RSS(ref_grid_create(&surrogate, ref_mpi), "create grid");
      RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_GLOB_TYPE), "bcast nnode");
      RSS(ref_node_initialize_n_global(ref_grid_node(surrogate), nnode),
          "init nnodesg");
    }
    /* performance regression in ref_geom_ghost */
    RSS(ref_migrate_replicate_ghost(surrogate), "replicant");
  }
  RSS(ref_geom_share_context(ref_grid_geom(surrogate), ref_grid_geom(ref_grid)),
      "share context");
  if (ref_geom_model_loaded(ref_grid_geom(surrogate))) {
    RSS(ref_egads_mark_jump_degen(surrogate), "T and UV jumps; UV degen");
    RSS(ref_geom_verify_topo(surrogate), "geom topo");
  }
  RSS(ref_facelift_create(&ref_facelift, surrogate, REF_TRUE), "create");
  ref_geom_facelift(ref_grid_geom(ref_grid)) = ref_facelift;
  return REF_SUCCESS;
}